

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDM.cpp
# Opt level: O0

int WaitNsMDM(int n)

{
  int local_14;
  int i;
  int n_local;
  
  if ((bExit == 0) && (local_14 = n, AcousticCommandMDM != 0)) {
    for (; local_14 != 0; local_14 = local_14 + -1) {
      mSleep(1000);
      if ((bExit != 0) || (AcousticCommandMDM == 0)) {
        return 1;
      }
    }
    i = 0;
  }
  else {
    i = 1;
  }
  return i;
}

Assistant:

inline int WaitNsMDM(int n)
{
	int i = n;

	if (bExit||!AcousticCommandMDM) return EXIT_FAILURE;
	while (i)
	{
		mSleep(1000);
		if (bExit||!AcousticCommandMDM) return EXIT_FAILURE;
		i--;
	}

	return EXIT_SUCCESS;
}